

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::operator+(Matrix *this,Matrix *other)

{
  undefined1 auVar1 [16];
  runtime_error *this_00;
  ulong uVar2;
  double *data;
  long *in_RDX;
  Matrix MVar3;
  int local_3c;
  int i;
  double *aData;
  Matrix *other_local;
  Matrix *this_local;
  
  if ((*(int *)((long)in_RDX + 0xc) == other->cols) && ((int)in_RDX[1] == other->rows)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(other->rows * other->cols);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    data = (double *)operator_new__(uVar2);
    for (local_3c = 0; local_3c < other->rows * other->cols; local_3c = local_3c + 1) {
      data[local_3c] = other->data[local_3c] + *(double *)(*in_RDX + (long)local_3c * 8);
    }
    MVar3 = FromArray(this,data,other->rows,other->cols);
    MVar3.data = (double *)this;
    return MVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator+(const Matrix& other) const
{
    if (other.cols != cols || other.rows != rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    auto* aData = new double[rows * cols];
    for (int i = 0; i < rows * cols; ++i)
    {
        aData[i] = data[i] + other.data[i];
    }

    return FromArray(aData, rows, cols);
}